

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::makeArrayCopy<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  undefined1 local_b8 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> destType;
  undefined1 local_70 [8];
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> srcType;
  Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> _val_1;
  
  typeidx<wasm::WATParser::ParseModuleTypesCtx>
            ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
              *)local_b8,ctx);
  std::__detail::__variant::
  _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                     *)local_70,
                    (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                     *)local_b8);
  if (srcType.val.
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      ._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string
              ((string *)
               ((long)&srcType.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               + 0x20),(string *)local_70);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&srcType.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&srcType.val.
                       super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               + 0x20));
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         *)local_70);
    typeidx<wasm::WATParser::ParseModuleTypesCtx>
              ((Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
                *)local_70,ctx);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       *)((long)&srcType.val.
                                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         + 0x20),
                      (_Copy_ctor_base<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       *)local_70);
    if (_val_1.val.
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&destType.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                 + 0x20),(string *)
                         ((long)&srcType.val.
                                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         + 0x20));
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&destType.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                 + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&destType.val.
                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                 + 0x20));
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&srcType.val.
                                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                             + 0x20));
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                           *)((long)&srcType.val.
                                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                             + 0x20));
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       *)local_70);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                       *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

Result<>
makeArrayCopy(Ctx& ctx, Index pos, const std::vector<Annotation>& annotations) {
  auto destType = typeidx(ctx);
  CHECK_ERR(destType);
  auto srcType = typeidx(ctx);
  CHECK_ERR(srcType);
  return ctx.makeArrayCopy(pos, annotations, *destType, *srcType);
}